

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_rawset(jit_State *J,RecordFFData *rd)

{
  long *in_RSI;
  long in_RDI;
  RecordIndex ix;
  undefined1 local_c0 [16];
  IRIns *local_b0 [4];
  GCRef local_90;
  MRef local_8c;
  GCRef local_88;
  undefined4 local_7c;
  undefined8 *local_68;
  lua_State *local_60;
  BCIns *local_58;
  GCfunc *local_50;
  GCproto *local_48;
  TRef *local_40;
  RecordIndex *local_38;
  jit_State *local_30;
  IRIns local_28;
  undefined4 local_1c;
  
  local_90.gcptr32 = **(uint **)(in_RDI + 0x80);
  local_8c.ptr32 = *(uint32_t *)(*(long *)(in_RDI + 0x80) + 4);
  local_88.gcptr32 = *(BCIns *)(*(long *)(in_RDI + 0x80) + 8);
  if ((((local_90.gcptr32 & 0x1f000000) == 0xb000000) && (local_8c.ptr32 != 0)) &&
     (local_88.gcptr32 != 0)) {
    local_7c = 0;
    local_28 = *(IRIns *)(in_RDI + 0x60);
    local_30 = (jit_State *)local_c0;
    local_c0._0_4_ = *(uint *)*in_RSI;
    local_38 = (RecordIndex *)(ulong)(uint)local_c0._0_4_;
    local_1c = 0xfffffff4;
    local_c0[4] = 0xf4;
    local_c0[5] = 0xff;
    local_c0[6] = 0xff;
    local_c0[7] = 0xff;
    local_40 = *(TRef **)(in_RDI + 0x60);
    local_48 = (GCproto *)(local_c0 + 8);
    local_50 = (GCfunc *)(*in_RSI + 8);
    local_c0._8_8_ = *(undefined8 *)local_50;
    local_58 = *(BCIns **)(in_RDI + 0x60);
    local_60 = (lua_State *)local_b0;
    local_68 = (undefined8 *)(*in_RSI + 0x10);
    local_b0[0] = (IRIns *)*local_68;
    lj_record_idx(local_30,local_38);
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_rawset(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0]; ix.key = J->base[1]; ix.val = J->base[2];
  if (tref_istab(ix.tab) && ix.key && ix.val) {
    ix.idxchain = 0;
    settabV(J->L, &ix.tabv, tabV(&rd->argv[0]));
    copyTV(J->L, &ix.keyv, &rd->argv[1]);
    copyTV(J->L, &ix.valv, &rd->argv[2]);
    lj_record_idx(J, &ix);
    /* Pass through table at J->base[0] as result. */
  }  /* else: Interpreter will throw. */
}